

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_mul_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,_Bool inplace)

{
  bool bVar1;
  byte bVar2;
  _Bool _Var3;
  ggml_tensor *ctx_00;
  ggml_tensor *pgVar4;
  byte in_CL;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  _Bool is_node;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  
  bVar2 = in_CL & 1;
  _Var3 = ggml_are_same_shape(in_RSI,in_RDX);
  if (!_Var3) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xc3a,
            "ggml_are_same_shape(a, b)");
    abort();
  }
  bVar1 = false;
  if ((bVar2 == 0) && ((in_RSI->grad != (ggml_tensor *)0x0 || (in_RDX->grad != (ggml_tensor *)0x0)))
     ) {
    bVar1 = true;
  }
  if ((bVar2 != 0) && (bVar1)) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xc43,
            "is_node == false");
    abort();
  }
  if (bVar2 == 0) {
    ctx_00 = ggml_dup_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    ctx_00 = ggml_view_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  ctx_00->op = GGML_OP_MUL;
  if (bVar1) {
    pgVar4 = ggml_dup_tensor((ggml_context *)ctx_00,in_stack_ffffffffffffffc8);
  }
  else {
    pgVar4 = (ggml_tensor *)0x0;
  }
  ctx_00->grad = pgVar4;
  ctx_00->src0 = in_RSI;
  ctx_00->src1 = in_RDX;
  return ctx_00;
}

Assistant:

struct ggml_tensor * ggml_mul_impl(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b,
        bool inplace) {
    GGML_ASSERT(ggml_are_same_shape(a, b));

    bool is_node = false;

    if (!inplace && (a->grad || b->grad)) {
        is_node = true;
    }

    if (inplace) {
        GGML_ASSERT(is_node == false);
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op   = GGML_OP_MUL;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}